

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O1

Index wasm::Bits::getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                (Expression *curr,DummyLocalInfoProvider *localInfoProvider)

{
  Id IVar1;
  ulong uVar2;
  uintptr_t uVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  Index IVar7;
  Index IVar8;
  uint uVar9;
  Expression *pEVar10;
  Index IVar11;
  anon_union_16_6_1532cd5a_for_Literal_0 local_48;
  long local_38;
  
  IVar1 = curr->_id;
  IVar11 = 1;
  if (IVar1 < RefEqId) {
    if (IVar1 == UnaryId) {
      bVar5 = Unary::isRelational((Unary *)curr);
    }
    else {
      if (IVar1 != BinaryId) {
        if (IVar1 == RefIsNullId) {
          return 1;
        }
        goto LAB_009e4a64;
      }
      bVar5 = Binary::isRelational((Binary *)curr);
    }
LAB_009e4a5c:
    if (bVar5 != false) {
      return 1;
    }
  }
  else {
    if (IVar1 == RefEqId) {
      return 1;
    }
    if (IVar1 == RefTestId) {
      return 1;
    }
    if (IVar1 == StringEqId) {
      bVar5 = *(int *)(curr + 1) == 0;
      goto LAB_009e4a5c;
    }
  }
LAB_009e4a64:
  IVar1 = curr->_id;
  if (IVar1 == ConstId) {
    uVar2 = (curr->type).id;
    if (6 < uVar2) goto LAB_009e5120;
    iVar6 = (int)uVar2;
    if (iVar6 == 3) {
      Literal::countLeadingZeroes((Literal *)&local_48.func,(Literal *)(curr + 1));
      if (local_38 != 3) goto LAB_009e5157;
      iVar6 = 0x40;
    }
    else {
      if (iVar6 != 2) {
        handle_unreachable("invalid type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                           ,0xa3);
      }
      Literal::countLeadingZeroes((Literal *)&local_48.func,(Literal *)(curr + 1));
      if (local_38 != 2) goto LAB_009e5176;
      iVar6 = 0x20;
    }
    IVar11 = iVar6 - local_48._0_4_;
    Literal::~Literal((Literal *)&local_48.func);
    goto switchD_009e4b51_caseD_1;
  }
  if (curr == (Expression *)0x0 || IVar1 != BinaryId) {
    if (curr == (Expression *)0x0 || IVar1 != UnaryId) {
      if (curr == (Expression *)0x0 || IVar1 != LocalSetId) {
        if (curr != (Expression *)0x0 && IVar1 == LocalGetId) {
          if (localInfoProvider == (DummyLocalInfoProvider *)0x0) {
            __assert_fail("localInfoProvider",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                          ,0x1c3,
                          "Index wasm::Bits::getMaxBits(Expression *, LocalInfoProvider *) [LocalInfoProvider = wasm::Bits::DummyLocalInfoProvider]"
                         );
          }
          uVar3 = (curr->type).id;
          if (uVar3 == 2) {
            IVar11 = 0x20;
          }
          else {
            if (uVar3 != 3) {
              handle_unreachable("type has no integer bit size",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                                 ,0x8e);
            }
            IVar11 = 0x40;
          }
          goto LAB_009e4be2;
        }
        bVar5 = true;
        IVar11 = 1;
        if ((curr != (Expression *)0x0 && IVar1 == LoadId) &&
           ((local_48.i64 = (curr->type).id, 5 < local_48.func.super_IString.str._M_len ||
            ((0x32UL >> (local_48.func.super_IString.str._M_len & 0x3f) & 1) == 0)))) {
          IVar1 = curr[1]._id;
          IVar11 = (Index)IVar1;
          uVar9 = wasm::Type::getByteSize((Type *)&local_48.func);
          if ((IVar1 < uVar9) && (IVar11 = (uint)IVar1, curr[1].field_0x1 == '\0')) {
            IVar11 = (uint)curr[1]._id << 3;
            goto LAB_009e4be2;
          }
        }
      }
      else {
        IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                           ((Expression *)curr[1].type.id,localInfoProvider);
LAB_009e4be2:
        bVar5 = false;
      }
      if (bVar5) goto switchD_009e4bc6_caseD_6;
      goto LAB_009e50ae;
    }
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
    case 2:
    case 4:
      IVar11 = 6;
      break;
    case 1:
    case 3:
    case 5:
      IVar11 = 7;
      break;
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
switchD_009e4bc6_caseD_6:
      bVar5 = true;
      goto LAB_009e50b0;
    case 0x14:
    case 0x15:
      handle_unreachable("relationals handled before",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x1a2);
    case 0x16:
switchD_009e4bc6_caseD_16:
      IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      bVar5 = IVar7 < 0x20;
      goto LAB_009e508d;
    case 0x17:
    case 0x18:
      IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      bVar5 = IVar7 < 0x20;
      goto LAB_009e50a4;
    default:
      switch(*(undefined4 *)(curr + 1)) {
      case 0x2f:
        IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar5 = IVar7 < 8;
        goto LAB_009e50a4;
      case 0x30:
        IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar5 = IVar7 < 0x10;
LAB_009e50a4:
        IVar11 = 0x20;
        goto LAB_009e50aa;
      case 0x31:
        IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar5 = IVar7 < 8;
        break;
      case 0x32:
        IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar5 = IVar7 < 0x10;
        break;
      case 0x33:
        goto switchD_009e4bc6_caseD_16;
      default:
        goto switchD_009e4bc6_caseD_6;
      }
LAB_009e508d:
      IVar11 = 0x40;
LAB_009e50aa:
      if (bVar5) {
        IVar11 = IVar7;
      }
    }
LAB_009e50ae:
    bVar5 = false;
LAB_009e50b0:
    if (!bVar5) goto switchD_009e4b51_caseD_1;
switchD_009e4b51_caseD_32:
    bVar5 = true;
    goto LAB_009e50bc;
  }
  IVar11 = 0x20;
  IVar7 = 0x20;
  switch(*(undefined4 *)(curr + 1)) {
  case 0:
    IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       ((Expression *)curr[1].type.id,localInfoProvider);
    IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      (*(Expression **)(curr + 2),localInfoProvider);
    if (IVar7 < IVar11) {
      IVar7 = IVar11;
    }
    IVar7 = IVar7 + 1;
    goto LAB_009e4f4f;
  case 1:
  case 0xd:
  case 0xe:
    break;
  case 2:
    IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       (*(Expression **)(curr + 2),localInfoProvider);
    IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      ((Expression *)curr[1].type.id,localInfoProvider);
LAB_009e4f4c:
    IVar7 = IVar7 + IVar11;
LAB_009e4f4f:
    bVar5 = IVar7 < 0x20;
    IVar11 = 0x20;
    goto LAB_009e502a;
  case 3:
    pEVar10 = *(Expression **)(curr + 2);
    if ((pEVar10->_id != ConstId) ||
       (IVar8 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar8 == 0x20)) break;
    if (*(long *)(pEVar10 + 2) != 2) {
LAB_009e5176:
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    bVar5 = false;
    IVar11 = IVar7;
    if (-1 < *(int *)(pEVar10 + 1)) {
LAB_009e4f9c:
      bVar5 = false;
      IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(pEVar10,(DummyLocalInfoProvider *)0x0);
      IVar11 = (IVar8 - IVar7) + 1;
      if ((int)(IVar8 - IVar7) < 0) {
        IVar11 = 0;
      }
      if ((int)IVar8 <= (int)IVar11) {
        IVar11 = IVar8;
      }
    }
    goto LAB_009e50bc;
  case 4:
  case 0x1d:
    IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       ((Expression *)curr[1].type.id,localInfoProvider);
    bVar5 = false;
    if ((*(Expression **)(curr + 2))->_id == ConstId) {
      IVar8 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        (*(Expression **)(curr + 2),(DummyLocalInfoProvider *)0x0);
      IVar7 = (IVar11 - IVar8) + 1;
      if ((int)(IVar11 - IVar8) < 0) {
        IVar7 = 0;
      }
      if ((int)IVar7 < (int)IVar11) {
        IVar11 = IVar7;
      }
    }
    goto LAB_009e50bc;
  case 5:
    pcVar4 = *(char **)(curr + 2);
    if ((*pcVar4 != '\x0e') ||
       (IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar7 == 0x20)) break;
    if (*(long *)(pcVar4 + 0x20) != 2) goto LAB_009e5176;
    uVar9 = ceilLog2(*(uint32_t *)(pcVar4 + 0x10));
LAB_009e4e34:
    if (uVar9 < IVar7) {
      IVar7 = uVar9;
    }
LAB_009e5068:
    bVar5 = false;
    IVar11 = IVar7;
    goto LAB_009e50bc;
  case 6:
    pcVar4 = *(char **)(curr + 2);
    if (*pcVar4 == '\x0e') {
      IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                         ((Expression *)curr[1].type.id,localInfoProvider);
      if (*(long *)(pcVar4 + 0x20) != 2) goto LAB_009e5176;
      IVar7 = ceilLog2(*(uint32_t *)(pcVar4 + 0x10));
      goto LAB_009e4cc4;
    }
    break;
  case 7:
  case 0x20:
    IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       ((Expression *)curr[1].type.id,localInfoProvider);
    IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      (*(Expression **)(curr + 2),localInfoProvider);
    goto LAB_009e4cc4;
  case 8:
  case 9:
  case 0x21:
  case 0x22:
    IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      ((Expression *)curr[1].type.id,localInfoProvider);
    IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       (*(Expression **)(curr + 2),localInfoProvider);
    if (IVar11 < IVar7) {
      IVar11 = IVar7;
    }
    break;
  case 10:
    pEVar10 = *(Expression **)(curr + 2);
    if (pEVar10->_id == ConstId) {
      IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                         ((Expression *)curr[1].type.id,localInfoProvider);
      IVar7 = getEffectiveShifts(pEVar10);
      goto LAB_009e4f4c;
    }
    break;
  case 0xb:
    pEVar10 = *(Expression **)(curr + 2);
    if (pEVar10->_id == ConstId) {
      uVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      bVar5 = false;
      IVar11 = IVar7;
      if (uVar9 == 0x20) goto LAB_009e50bc;
LAB_009e5052:
      IVar11 = getEffectiveShifts(pEVar10);
      IVar7 = uVar9 - IVar11;
      if (uVar9 < IVar11) {
        IVar7 = 0;
      }
      if (uVar9 < IVar11 || uVar9 - IVar11 == 0) {
        IVar7 = 0;
      }
      goto LAB_009e5068;
    }
    break;
  case 0xc:
    pEVar10 = *(Expression **)(curr + 2);
    bVar5 = false;
    IVar11 = IVar7;
    if (pEVar10->_id == ConstId) {
LAB_009e4e55:
      bVar5 = false;
      IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      IVar8 = getEffectiveShifts(pEVar10);
      IVar11 = IVar7 - IVar8;
      if (IVar7 < IVar8) {
        IVar11 = 0;
      }
      if (IVar7 < IVar8 || IVar7 - IVar8 == 0) {
        IVar11 = 0;
      }
    }
    goto LAB_009e50bc;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
    handle_unreachable("relationals handled before",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                       ,0x192);
  case 0x19:
    IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       ((Expression *)curr[1].type.id,localInfoProvider);
    IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      (*(Expression **)(curr + 2),localInfoProvider);
    if (IVar7 < IVar11) {
      IVar7 = IVar11;
    }
    IVar7 = IVar7 + 1;
    goto LAB_009e5021;
  case 0x1a:
  case 0x26:
  case 0x27:
switchD_009e4b51_caseD_1a:
    IVar11 = 0x40;
    break;
  case 0x1b:
    IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       (*(Expression **)(curr + 2),localInfoProvider);
    IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      ((Expression *)curr[1].type.id,localInfoProvider);
    IVar7 = IVar7 + IVar11;
    goto LAB_009e5021;
  case 0x1c:
    pEVar10 = *(Expression **)(curr + 2);
    IVar11 = 0x40;
    if ((pEVar10->_id != ConstId) ||
       (IVar8 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar8 == 0x40)) break;
    if (*(long *)(pEVar10 + 2) != 3) {
LAB_009e5157:
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x129,"int64_t wasm::Literal::geti64() const");
    }
    bVar5 = false;
    IVar11 = 0x40;
    if (-1 < *(long *)(pEVar10 + 1)) goto LAB_009e4f9c;
    goto LAB_009e50bc;
  case 0x1e:
    pcVar4 = *(char **)(curr + 2);
    IVar11 = 0x40;
    if ((*pcVar4 == '\x0e') &&
       (IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar7 != 0x40)) {
      if (*(long *)(pcVar4 + 0x20) != 3) goto LAB_009e5157;
      uVar9 = ceilLog2(*(uint64_t *)(pcVar4 + 0x10));
      goto LAB_009e4e34;
    }
    break;
  case 0x1f:
    pcVar4 = *(char **)(curr + 2);
    if (*pcVar4 != '\x0e') goto switchD_009e4b51_caseD_1a;
    IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       ((Expression *)curr[1].type.id,localInfoProvider);
    if (*(long *)(pcVar4 + 0x20) != 3) goto LAB_009e5157;
    IVar7 = ceilLog2(*(uint64_t *)(pcVar4 + 0x10));
LAB_009e4cc4:
    bVar5 = IVar7 < IVar11;
    goto LAB_009e502a;
  case 0x23:
    pEVar10 = *(Expression **)(curr + 2);
    if (pEVar10->_id != ConstId) goto switchD_009e4b51_caseD_1a;
    IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                       ((Expression *)curr[1].type.id,localInfoProvider);
    IVar7 = getEffectiveShifts(pEVar10);
    IVar7 = IVar7 + IVar11;
LAB_009e5021:
    bVar5 = IVar7 < 0x40;
    IVar11 = 0x40;
LAB_009e502a:
    if (bVar5) {
      IVar11 = IVar7;
    }
    break;
  case 0x24:
    pEVar10 = *(Expression **)(curr + 2);
    IVar11 = 0x40;
    if (pEVar10->_id != ConstId) break;
    uVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      ((Expression *)curr[1].type.id,localInfoProvider);
    bVar5 = false;
    IVar11 = 0x40;
    if (uVar9 != 0x40) goto LAB_009e5052;
    goto LAB_009e50bc;
  case 0x25:
    pEVar10 = *(Expression **)(curr + 2);
    bVar5 = false;
    if (pEVar10->_id == ConstId) goto LAB_009e4e55;
    IVar11 = 0x40;
    goto LAB_009e50bc;
  default:
    goto switchD_009e4b51_caseD_32;
  }
switchD_009e4b51_caseD_1:
  bVar5 = false;
LAB_009e50bc:
  if (bVar5) {
    uVar2 = (curr->type).id;
    if (6 < uVar2) {
LAB_009e5120:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    uVar9 = (int)uVar2 - 1;
    if (2 < uVar9) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x1d4);
    }
    IVar11 = *(Index *)(&DAT_00e16564 + (ulong)uVar9 * 4);
  }
  return IVar11;
}

Assistant:

Index getMaxBits(Expression* curr,
                 LocalInfoProvider* localInfoProvider = nullptr) {
  if (Properties::emitsBoolean(curr)) {
    return 1;
  }
  if (auto* c = curr->dynCast<Const>()) {
    switch (curr->type.getBasic()) {
      case Type::i32:
        return 32 - c->value.countLeadingZeroes().geti32();
      case Type::i64:
        return 64 - c->value.countLeadingZeroes().geti64();
      default:
        WASM_UNREACHABLE("invalid type");
    }
  } else if (auto* binary = curr->dynCast<Binary>()) {
    switch (binary->op) {
      // 32-bit
      case RotLInt32:
      case RotRInt32:
      case SubInt32:
        return 32;
      case AddInt32: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(32), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt32: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(32), maxBitsLeft + maxBitsRight);
      }
      case DivSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // If either side might be negative, then the result will be negative
          if (maxBitsLeft == 32 || c->value.geti32() < 0) {
            return 32;
          }
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return 32;
      }
      case DivUInt32: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return maxBitsLeft;
      }
      case RemSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 32) {
            return 32;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case RemUInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case AndInt32: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt32:
      case XorInt32: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt32: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          return std::min(Index(32),
                          getMaxBits(binary->left, localInfoProvider) +
                            Bits::getEffectiveShifts(shifts));
        }
        return 32;
      }
      case ShrUInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case ShrSInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 32) {
            return 32;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case RotLInt64:
      case RotRInt64:
      case SubInt64:
        return 64;
      case AddInt64: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(64), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt64: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(64), maxBitsLeft + maxBitsRight);
      }
      case DivSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left or right const value is negative
          if (maxBitsLeft == 64 || c->value.geti64() < 0) {
            return 64;
          }
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return 64;
      }
      case DivUInt64: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return maxBitsLeft;
      }
      case RemSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 64) {
            return 64;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case RemUInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case AndInt64: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt64:
      case XorInt64: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt64: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          return std::min(Index(64),
                          Bits::getEffectiveShifts(shifts) + maxBits);
        }
        return 64;
      }
      case ShrUInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      case ShrSInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 64) {
            return 64;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      // comparisons
      case EqInt32:
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case LeSInt32:
      case LeUInt32:
      case GtSInt32:
      case GtUInt32:
      case GeSInt32:
      case GeUInt32:

      case EqInt64:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case LeSInt64:
      case LeUInt64:
      case GtSInt64:
      case GtUInt64:
      case GeSInt64:
      case GeUInt64:

      case EqFloat32:
      case NeFloat32:
      case LtFloat32:
      case LeFloat32:
      case GtFloat32:
      case GeFloat32:

      case EqFloat64:
      case NeFloat64:
      case LtFloat64:
      case LeFloat64:
      case GtFloat64:
      case GeFloat64:
        WASM_UNREACHABLE("relationals handled before");
      default: {
      }
    }
  } else if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      case EqZInt32:
      case EqZInt64:
        WASM_UNREACHABLE("relationals handled before");
      case WrapInt64:
      case ExtendUInt32:
        return std::min(Index(32), getMaxBits(unary->value, localInfoProvider));
      case ExtendS8Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(32) : maxBits;
      }
      case ExtendS16Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(32) : maxBits;
      }
      case ExtendS8Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(64) : maxBits;
      }
      case ExtendS16Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(64) : maxBits;
      }
      case ExtendS32Int64:
      case ExtendSInt32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 32 ? Index(64) : maxBits;
      }
      default: {
      }
    }
  } else if (auto* set = curr->dynCast<LocalSet>()) {
    // a tee passes through the value
    return getMaxBits(set->value, localInfoProvider);
  } else if (auto* get = curr->dynCast<LocalGet>()) {
    // TODO: Should this be optional?
    assert(localInfoProvider);
    return localInfoProvider->getMaxBitsForLocal(get);
  } else if (auto* load = curr->dynCast<Load>()) {
    // if signed, then the sign-extension might fill all the bits
    // if unsigned, then we have a limit
    if (LoadUtils::isSignRelevant(load) && !load->signed_) {
      return 8 * load->bytes;
    }
  }
  switch (curr->type.getBasic()) {
    case Type::i32:
      return 32;
    case Type::i64:
      return 64;
    case Type::unreachable:
      return 64; // not interesting, but don't crash
    default:
      WASM_UNREACHABLE("invalid type");
  }
}